

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void lowbd_write_buffer_8xn_sse2(__m128i *in,uint8_t *output,int stride,int flipud,int height)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long lVar2;
  longlong in_RDI;
  int in_R8D;
  undefined8 extraout_XMM0_Qa;
  __m128i pred;
  __m128i res;
  __m128i u;
  __m128i v;
  int i;
  int step;
  int j;
  undefined4 local_8c;
  undefined4 local_60;
  undefined4 local_58;
  
  if (in_ECX == 0) {
    local_8c = 0;
  }
  else {
    local_8c = in_R8D + -1;
  }
  local_58 = local_8c;
  iVar1 = 1;
  if (in_ECX != 0) {
    iVar1 = -1;
  }
  lVar2 = in_RSI;
  for (local_60 = 0; local_60 < in_R8D; local_60 = local_60 + 1) {
    res[0] = (ulong)in_EDX;
    res[1] = (long)local_58 << 4;
    pred[1] = lVar2;
    pred[0] = in_RDI;
    lowbd_get_recon_8x8_sse2(pred,res);
    *(undefined8 *)(in_RSI + (int)(local_60 * in_EDX)) = extraout_XMM0_Qa;
    local_58 = iVar1 + local_58;
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_8xn_sse2(__m128i *in, uint8_t *output,
                                               int stride, int flipud,
                                               const int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    const __m128i v = _mm_loadl_epi64((__m128i const *)(output + i * stride));
    const __m128i u = lowbd_get_recon_8x8_sse2(v, in[j]);
    _mm_storel_epi64((__m128i *)(output + i * stride), u);
  }
}